

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS
ref_interp_scalar(REF_INTERP ref_interp,REF_INT leading_dim,REF_DBL *from_scalar,REF_DBL *to_scalar)

{
  REF_NODE ref_node;
  REF_MPI ref_mpi_00;
  uint uVar1;
  void *send;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *recept_cell;
  REF_INT *recept_node;
  REF_INT *recept_ret;
  REF_INT *recept_proc;
  REF_INT *donor_cell;
  REF_INT *donor_ret;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_bary;
  REF_DBL *donor_scalar;
  REF_DBL *recept_scalar;
  REF_INT n_donor;
  REF_INT donation;
  REF_INT n_recept;
  REF_INT receptor;
  REF_INT nodes [27];
  int local_64;
  int local_60;
  REF_INT im;
  REF_INT ibary;
  REF_INT node;
  REF_CELL from_cell;
  REF_MPI ref_mpi;
  REF_NODE to_node;
  REF_GRID from_grid;
  REF_GRID to_grid;
  REF_DBL *to_scalar_local;
  REF_DBL *from_scalar_local;
  REF_INT leading_dim_local;
  REF_INTERP ref_interp_local;
  
  ref_node = ref_interp->to_grid->node;
  ref_mpi_00 = ref_interp->to_grid->mpi;
  if (ref_interp->from_grid->twod == 0) {
    _ibary = ref_interp->from_tet;
  }
  else {
    _ibary = ref_interp->from_tri;
  }
  n_donor = 0;
  for (im = 0; im < ref_node->max; im = im + 1) {
    if ((((-1 < im) && (im < ref_node->max)) && (-1 < ref_node->global[im])) &&
       (ref_node->ref_mpi->id == ref_node->part[im])) {
      n_donor = n_donor + 1;
    }
  }
  if (n_donor * 4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x81e,
           "ref_interp_scalar","malloc recept_bary of REF_DBL negative");
    ref_interp_local._4_4_ = 1;
  }
  else {
    donor_bary = (REF_DBL *)malloc((long)(n_donor << 2) << 3);
    if (donor_bary == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x81e,"ref_interp_scalar","malloc recept_bary of REF_DBL NULL");
      ref_interp_local._4_4_ = 2;
    }
    else if (n_donor < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x81f,"ref_interp_scalar","malloc recept_cell of REF_INT negative");
      ref_interp_local._4_4_ = 1;
    }
    else {
      send = malloc((long)n_donor << 2);
      if (send == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x81f,"ref_interp_scalar","malloc recept_cell of REF_INT NULL");
        ref_interp_local._4_4_ = 2;
      }
      else if (n_donor < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x820,"ref_interp_scalar","malloc recept_node of REF_INT negative");
        ref_interp_local._4_4_ = 1;
      }
      else {
        recept_cell = (REF_INT *)malloc((long)n_donor << 2);
        if (recept_cell == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x820,"ref_interp_scalar","malloc recept_node of REF_INT NULL");
          ref_interp_local._4_4_ = 2;
        }
        else if (n_donor < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x821,"ref_interp_scalar","malloc recept_ret of REF_INT negative");
          ref_interp_local._4_4_ = 1;
        }
        else {
          recept_node = (REF_INT *)malloc((long)n_donor << 2);
          if (recept_node == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x821,"ref_interp_scalar","malloc recept_ret of REF_INT NULL");
            ref_interp_local._4_4_ = 2;
          }
          else if (n_donor < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x822,"ref_interp_scalar","malloc recept_proc of REF_INT negative");
            ref_interp_local._4_4_ = 1;
          }
          else {
            recept_ret = (REF_INT *)malloc((long)n_donor << 2);
            if (recept_ret == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x822,"ref_interp_scalar","malloc recept_proc of REF_INT NULL");
              ref_interp_local._4_4_ = 2;
            }
            else {
              n_donor = 0;
              for (im = 0; im < ref_node->max; im = im + 1) {
                if (((-1 < im) && (im < ref_node->max)) &&
                   ((-1 < ref_node->global[im] && (ref_node->ref_mpi->id == ref_node->part[im])))) {
                  if (ref_interp->cell[im] == -1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x827,"ref_interp_scalar","node needs to be localized");
                    return 1;
                  }
                  uVar1 = ref_node_clip_bary4(ref_interp->bary + (im << 2),
                                              donor_bary + (n_donor << 2));
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x82a,"ref_interp_scalar",(ulong)uVar1,"clip");
                    return uVar1;
                  }
                  recept_ret[n_donor] = ref_interp->part[im];
                  *(REF_INT *)((long)send + (long)n_donor * 4) = ref_interp->cell[im];
                  recept_cell[n_donor] = im;
                  recept_node[n_donor] = ref_mpi_00->id;
                  n_donor = n_donor + 1;
                }
              }
              ref_interp_local._4_4_ =
                   ref_mpi_blindsend(ref_mpi_00,recept_ret,send,1,n_donor,&recept_proc,
                                     (REF_INT *)&recept_scalar,1);
              if (ref_interp_local._4_4_ == 0) {
                ref_interp_local._4_4_ =
                     ref_mpi_blindsend(ref_mpi_00,recept_ret,recept_node,1,n_donor,&donor_cell,
                                       (REF_INT *)&recept_scalar,1);
                if (ref_interp_local._4_4_ == 0) {
                  ref_interp_local._4_4_ =
                       ref_mpi_blindsend(ref_mpi_00,recept_ret,recept_cell,1,n_donor,&donor_ret,
                                         (REF_INT *)&recept_scalar,1);
                  if (ref_interp_local._4_4_ == 0) {
                    ref_interp_local._4_4_ =
                         ref_mpi_blindsend(ref_mpi_00,recept_ret,donor_bary,4,n_donor,&donor_node,
                                           (REF_INT *)&recept_scalar,3);
                    if (ref_interp_local._4_4_ == 0) {
                      if (recept_ret != (REF_INT *)0x0) {
                        free(recept_ret);
                      }
                      if (recept_node != (REF_INT *)0x0) {
                        free(recept_node);
                      }
                      if (recept_cell != (REF_INT *)0x0) {
                        free(recept_cell);
                      }
                      if (send != (void *)0x0) {
                        free(send);
                      }
                      if (donor_bary != (REF_DBL *)0x0) {
                        free(donor_bary);
                      }
                      if (leading_dim * (int)recept_scalar < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x846,"ref_interp_scalar","malloc donor_scalar of REF_DBL negative")
                        ;
                        ref_interp_local._4_4_ = 1;
                      }
                      else {
                        recept_bary = (REF_DBL *)
                                      malloc((long)(leading_dim * (int)recept_scalar) << 3);
                        if (recept_bary == (REF_DBL *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x846,"ref_interp_scalar","malloc donor_scalar of REF_DBL NULL");
                          ref_interp_local._4_4_ = 2;
                        }
                        else {
                          for (recept_scalar._4_4_ = 0; recept_scalar._4_4_ < (int)recept_scalar;
                              recept_scalar._4_4_ = recept_scalar._4_4_ + 1) {
                            uVar1 = ref_cell_nodes(_ibary,recept_proc[recept_scalar._4_4_],&n_recept
                                                  );
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x84a,"ref_interp_scalar",(ulong)uVar1,
                                     "node needs to be localized");
                              return uVar1;
                            }
                            for (local_64 = 0; local_64 < leading_dim; local_64 = local_64 + 1) {
                              recept_bary[local_64 + leading_dim * recept_scalar._4_4_] = 0.0;
                              for (local_60 = 0; local_60 < _ibary->node_per;
                                  local_60 = local_60 + 1) {
                                iVar2 = local_64 + leading_dim * recept_scalar._4_4_;
                                recept_bary[iVar2] =
                                     *(double *)
                                      (donor_node + (long)(local_60 + recept_scalar._4_4_ * 4) * 2)
                                     * from_scalar[local_64 + leading_dim * (&n_recept)[local_60]] +
                                     recept_bary[iVar2];
                              }
                            }
                          }
                          if (recept_proc != (REF_INT *)0x0) {
                            free(recept_proc);
                          }
                          if (donor_node != (REF_INT *)0x0) {
                            free(donor_node);
                          }
                          ref_interp_local._4_4_ =
                               ref_mpi_blindsend(ref_mpi_00,donor_cell,recept_bary,leading_dim,
                                                 (int)recept_scalar,&donor_scalar,&n_donor,3);
                          if (ref_interp_local._4_4_ == 0) {
                            ref_interp_local._4_4_ =
                                 ref_mpi_blindsend(ref_mpi_00,donor_cell,donor_ret,1,
                                                   (int)recept_scalar,&recept_cell,&n_donor,1);
                            if (ref_interp_local._4_4_ == 0) {
                              if (recept_bary != (REF_DBL *)0x0) {
                                free(recept_bary);
                              }
                              if (donor_ret != (REF_INT *)0x0) {
                                free(donor_ret);
                              }
                              if (donor_cell != (REF_INT *)0x0) {
                                free(donor_cell);
                              }
                              for (donation = 0; donation < n_donor; donation = donation + 1) {
                                iVar2 = recept_cell[donation];
                                for (local_64 = 0; local_64 < leading_dim; local_64 = local_64 + 1)
                                {
                                  if (0x7fefffffffffffff <
                                      (ulong)ABS(donor_scalar[local_64 + leading_dim * donation])) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x872,"ref_interp_scalar","recept_scalar");
                                    return 1;
                                  }
                                  to_scalar[local_64 + leading_dim * iVar2] =
                                       donor_scalar[local_64 + leading_dim * donation];
                                }
                              }
                              if (recept_cell != (REF_INT *)0x0) {
                                free(recept_cell);
                              }
                              if (donor_scalar != (REF_DBL *)0x0) {
                                free(donor_scalar);
                              }
                              ref_interp_local._4_4_ =
                                   ref_node_ghost_dbl(ref_node,to_scalar,leading_dim);
                              if (ref_interp_local._4_4_ == 0) {
                                for (im = 0; im < ref_node->max; im = im + 1) {
                                  if (((-1 < im) && (im < ref_node->max)) &&
                                     (-1 < ref_node->global[im])) {
                                    for (local_64 = 0; local_64 < leading_dim;
                                        local_64 = local_64 + 1) {
                                      if (0x7fefffffffffffff <
                                          (ulong)ABS(to_scalar[local_64 + leading_dim * im])) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                               ,0x885,"ref_interp_scalar","to_scalar ghost");
                                        return 1;
                                      }
                                    }
                                  }
                                }
                                ref_interp_local._4_4_ = 0;
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x882,"ref_interp_scalar",(ulong)ref_interp_local._4_4_,
                                       "ghost");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x869,"ref_interp_scalar",(ulong)ref_interp_local._4_4_,
                                     "blind send node");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x866,"ref_interp_scalar",(ulong)ref_interp_local._4_4_,
                                   "blind send bary");
                          }
                        }
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x83e,"ref_interp_scalar",(ulong)ref_interp_local._4_4_,
                             "blind send bary");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x83b,"ref_interp_scalar",(ulong)ref_interp_local._4_4_,
                           "blind send node");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x838,"ref_interp_scalar",(ulong)ref_interp_local._4_4_,"blind send ret");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x835,"ref_interp_scalar",(ulong)ref_interp_local._4_4_,"blind send cell");
              }
            }
          }
        }
      }
    }
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_scalar(REF_INTERP ref_interp, REF_INT leading_dim,
                                     REF_DBL *from_scalar, REF_DBL *to_scalar) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_MPI ref_mpi = ref_grid_mpi(to_grid);
  REF_CELL from_cell;
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_scalar, *donor_scalar, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_scalar, leading_dim * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (im = 0; im < leading_dim; im++) {
      donor_scalar[im + leading_dim * donation] = 0.0;
      for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
        donor_scalar[im + leading_dim * donation] +=
            donor_bary[ibary + 4 * donation] *
            from_scalar[im + leading_dim * nodes[ibary]];
      }
      /*
      RAB(isfinite(donor_scalar[im + leading_dim * donation]), "donor_scalar", {
        printf("%.20e\n", donor_scalar[im + leading_dim * donation]);
        for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
          printf("%.20e %.20e %.20e\n",
                 donor_bary[ibary + 4 * donation] *
                     from_scalar[im + leading_dim * nodes[ibary]],
                 donor_bary[ibary + 4 * donation],
                 from_scalar[im + leading_dim * nodes[ibary]]);
        }
      });
      */
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_scalar, leading_dim,
                        n_donor, (void **)(&recept_scalar), &n_recept,
                        REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_scalar);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(recept_scalar[im + leading_dim * receptor]),
          "recept_scalar");
      to_scalar[im + leading_dim * node] =
          recept_scalar[im + leading_dim * receptor];
    }
  }

  ref_free(recept_node);
  ref_free(recept_scalar);

  /*
  each_ref_node_valid_node(to_node, node) {
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(to_scalar[im + leading_dim * node]), "to_scalar local");
    }
  }
  */
  RSS(ref_node_ghost_dbl(to_node, to_scalar, leading_dim), "ghost");
  each_ref_node_valid_node(to_node, node) {
    for (im = 0; im < leading_dim; im++) {
      RAS(isfinite(to_scalar[im + leading_dim * node]), "to_scalar ghost");
    }
  }

  return REF_SUCCESS;
}